

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

void fmt::v7::
     print<std::basic_string_view<char,std::char_traits<char>>,double_const&,unsigned_long_const&,double_const&,long_const&,char>
               (FILE *f,basic_string_view<char,_std::char_traits<char>_> *format_str,double *args,
               unsigned_long *args_1,double *args_2,long *args_3)

{
  basic_string_view<char,_std::char_traits<char>_> *f_00;
  char *extraout_RDX;
  std_string_view<char> s;
  remove_reference_t<const_long_&> *in_stack_ffffffffffffff18;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_d8;
  v7 *local_c8;
  double local_c0;
  string_view local_b8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_double,_const_unsigned_long,_const_double,_const_long>
  local_a8;
  FILE *local_68;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_double,_const_unsigned_long,_const_double,_const_long>
  *vargs;
  long *args_local_3;
  double *args_local_2;
  unsigned_long *args_local_1;
  double *args_local;
  basic_string_view<char,_std::char_traits<char>_> *format_str_local;
  FILE *f_local;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  FILE *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  FILE *local_10;
  
  vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_double,_const_unsigned_long,_const_double,_const_long>
           *)args_3;
  args_local_3 = (long *)args_2;
  args_local_2 = (double *)args_1;
  args_local_1 = (unsigned_long *)args;
  args_local = (double *)format_str;
  format_str_local = (basic_string_view<char,_std::char_traits<char>_> *)f;
  make_args_checked<double_const&,unsigned_long_const&,double_const&,long_const&,std::basic_string_view<char,std::char_traits<char>>,char>
            (&local_a8,(v7 *)format_str,(basic_string_view<char,_std::char_traits<char>_> *)args,
             (remove_reference_t<const_double_&> *)args_1,
             (remove_reference_t<const_unsigned_long_&> *)args_2,
             (remove_reference_t<const_double_&> *)args_3,in_stack_ffffffffffffff18);
  f_00 = format_str_local;
  local_68 = (FILE *)&local_a8;
  local_c8 = (v7 *)*args_local;
  local_c0 = args_local[1];
  s._M_str = extraout_RDX;
  s._M_len = (size_t)local_c0;
  local_b8 = to_string_view<char,_0>(local_c8,s);
  local_28 = &local_d8;
  f_local = local_68;
  local_20 = local_68;
  local_10 = local_68;
  local_18 = local_28;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
  basic_format_args(local_28,0x3a4a,
                    (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)local_68);
  vprint((FILE *)f_00,local_b8,(format_args)local_d8);
  return;
}

Assistant:

inline void print(std::FILE* f, const S& format_str, Args&&... args) {
  const auto& vargs = fmt::make_args_checked<Args...>(format_str, args...);
  return detail::is_unicode<Char>()
             ? vprint(f, to_string_view(format_str), vargs)
             : detail::vprint_mojibake(f, to_string_view(format_str), vargs);
}